

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interaction.cpp
# Opt level: O1

string * __thiscall
pbrt::MediumInteraction::ToString_abi_cxx11_(string *__return_storage_ptr__,MediumInteraction *this)

{
  ulong uVar1;
  MediumInterface *this_00;
  ulong uVar2;
  char *local_a8;
  char *local_a0;
  string local_98;
  string local_78;
  string local_58;
  char *local_38;
  
  uVar1 = *(ulong *)(this + 0x48);
  local_a0 = "(nullptr)";
  if ((uVar1 & 0xffffffffffff) != 0) {
    MediumHandle::ToString_abi_cxx11_(&local_58,(MediumHandle *)(this + 0x48));
    local_a0 = local_58._M_dataplus._M_p;
  }
  this_00 = *(MediumInterface **)(this + 0x40);
  local_a8 = "(nullptr)";
  if (this_00 != (MediumInterface *)0x0) {
    MediumInterface::ToString_abi_cxx11_(&local_78,this_00);
    local_a8 = local_78._M_dataplus._M_p;
  }
  uVar2 = *(ulong *)(this + 0x50);
  local_38 = "(nullptr)";
  if ((uVar2 & 0xffffffffffff) != 0) {
    PhaseFunctionHandle::ToString_abi_cxx11_(&local_98,(PhaseFunctionHandle *)(this + 0x50));
    local_38 = local_98._M_dataplus._M_p;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::
  stringPrintfRecursive<pbrt::Point3fi_const&,pbrt::Normal3<float>const&,pbrt::Point2<float>const&,pbrt::Vector3<float>const&,float_const&,pbrt::SampledSpectrum_const&,pbrt::SampledSpectrum_const&,pbrt::SampledSpectrum_const&,pbrt::SampledSpectrum_const&,char_const*,char_const*,char_const*>
            (__return_storage_ptr__,
             "[ MediumInteraction pi: %s n: %s uv: %s wo: %s time: %s sigma_a: %s sigma_s: %s sigma_maj: %s Le: %s medium: %s mediumInterface: %s phase: %s ]"
             ,(Point3fi *)this,(Normal3<float> *)(this + 0x28),(Point2<float> *)(this + 0x34),
             (Vector3<float> *)(this + 0x1c),(float *)(this + 0x18),(SampledSpectrum *)(this + 0x58)
             ,(SampledSpectrum *)(this + 0x68),(SampledSpectrum *)(this + 0x78),
             (SampledSpectrum *)(this + 0x88),&local_a0,&local_a8,&local_38);
  if (((uVar2 & 0xffffffffffff) != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2)) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((this_00 != (MediumInterface *)0x0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2)) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if (((uVar1 & 0xffffffffffff) != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2)) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string MediumInteraction::ToString() const {
    return StringPrintf(
        "[ MediumInteraction pi: %s n: %s uv: %s wo: %s time: %s "
        "sigma_a: %s sigma_s: %s sigma_maj: %s Le: %s medium: %s mediumInterface: %s "
        "phase: %s ]",
        pi, n, uv, wo, time, sigma_a, sigma_s, sigma_maj, Le,
        medium ? medium.ToString().c_str() : "(nullptr)",
        mediumInterface ? mediumInterface->ToString().c_str() : "(nullptr)",
        phase ? phase.ToString().c_str() : "(nullptr)");
}